

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O1

void av1_apply_temporal_filter_c
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  void *__s;
  void *__s_00;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  undefined7 in_register_00000011;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ushort uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  int ww;
  int iVar25;
  int iVar26;
  int i;
  ulong uVar27;
  int subblock_idx;
  long lVar28;
  long lVar29;
  ulong uVar30;
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  uint16_t *tgt16;
  double decay_factor [3];
  double d_factor [4];
  ulong local_160;
  uint local_11c;
  double local_78 [4];
  double local_58 [5];
  
  uVar30 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar1 = block_size_high[uVar30];
  iVar8 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar18 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar18 < iVar8) {
    iVar8 = iVar18;
  }
  bVar2 = block_size_wide[uVar30];
  uVar3 = frame_to_filter->flags;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  if (q_factor < 0x80) {
    dVar33 = (double)q_factor / 20.0;
    dVar33 = dVar33 * dVar33;
    dVar35 = 1.0;
    if (dVar33 <= 1.0) {
      dVar35 = dVar33;
    }
    dVar35 = (double)(-(ulong)(dVar33 < 1e-05) & 0x3ee4f8b588e368f1 |
                     ~-(ulong)(dVar33 < 1e-05) & (ulong)dVar35);
  }
  else {
    dVar35 = (double)q_factor * 0.015625;
    dVar35 = dVar35 * dVar35 * 0.5;
  }
  if (0 < num_planes) {
    dVar34 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
    dVar33 = 1.0;
    if (dVar34 <= 1.0) {
      dVar33 = dVar34;
    }
    uVar30 = 0;
    do {
      dVar31 = log(noise_levels[uVar30] + noise_levels[uVar30] + 5.0);
      local_78[uVar30] =
           1.0 / ((dVar31 + 0.5) * dVar35 *
                 (double)(-(ulong)(dVar34 < 1e-05) & 0x3ee4f8b588e368f1 |
                         ~-(ulong)(dVar34 < 1e-05) & (ulong)dVar33));
      uVar30 = uVar30 + 1;
    } while ((uint)num_planes != uVar30);
  }
  uVar3 = uVar3 >> 3;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  dVar35 = (double)iVar8 * 0.1;
  if (dVar35 <= 1.0) {
    dVar35 = 1.0;
  }
  lVar28 = 0;
  do {
    auVar32 = pshuflw(ZEXT416((uint)subblock_mvs[lVar28]),ZEXT416((uint)subblock_mvs[lVar28]),0x60);
    dVar33 = (double)(auVar32._0_4_ >> 0x10);
    dVar34 = (double)(auVar32._4_4_ >> 0x10);
    dVar33 = dVar34 * dVar34 + dVar33 * dVar33;
    if (dVar33 < 0.0) {
      dVar33 = sqrt(dVar33);
    }
    else {
      dVar33 = SQRT(dVar33);
    }
    dVar33 = dVar33 / dVar35;
    if (dVar33 <= 1.0) {
      dVar33 = 1.0;
    }
    local_58[lVar28] = dVar33;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 4);
  uVar30 = (ulong)((uint)bVar1 * (uint)bVar2 * 4);
  __s = aom_memalign(0x10,uVar30);
  if (__s == (void *)0x0) {
    aom_internal_error(mbd->error_info,AOM_CODEC_MEM_ERROR,"Error allocating temporal filter data");
  }
  memset(__s,0,uVar30);
  __s_00 = aom_memalign(0x20,uVar30);
  if (__s_00 == (void *)0x0) {
    aom_free(__s);
    aom_internal_error(mbd->error_info,AOM_CODEC_MEM_ERROR,"Error allocating temporal filter data");
  }
  memset(__s_00,0,uVar30);
  if (0 < num_planes) {
    uVar30 = 0;
    local_11c = 0;
    do {
      iVar8 = mbd->plane[uVar30].subsampling_x;
      iVar18 = mbd->plane[uVar30].subsampling_y;
      bVar7 = bVar1 >> ((byte)iVar18 & 0x1f);
      uVar14 = (uint)bVar7;
      bVar5 = (byte)iVar8 & 0x1f;
      uVar16 = (uint)(bVar2 >> bVar5);
      iVar18 = iVar18 - mbd->plane[0].subsampling_y;
      iVar8 = iVar8 - mbd->plane[0].subsampling_x;
      bVar12 = (byte)iVar8;
      bVar6 = (byte)iVar18;
      dVar35 = 0.04;
      if (uVar30 != 0) {
        dVar35 = 1.0 / (double)((1 << (bVar12 + bVar6 & 0x1f)) + 0x19);
      }
      iVar20 = *(int *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar30 != 0) * 4 + -0x28);
      puVar4 = frame_to_filter->store_buf_adr[uVar30 - 4];
      uVar11 = (ulong)uVar16;
      if ((uVar30 == 1) && (uVar14 != 0)) {
        uVar23 = 1 << (bVar6 & 0x1f);
        uVar15 = 1 << (bVar12 & 0x1f);
        iVar25 = uVar16 << (bVar12 & 0x1f);
        if ((int)uVar15 < 2) {
          uVar15 = 1;
        }
        if ((int)uVar23 < 2) {
          uVar23 = 1;
        }
        local_160 = 0;
        do {
          if (bVar2 >> bVar5 != 0) {
            uVar27 = 0;
            do {
              if (iVar18 != 0x1f) {
                iVar19 = ((int)uVar27 << (bVar12 & 0x1f)) +
                         ((int)local_160 << (bVar6 & 0x1f)) * iVar25;
                uVar10 = 0;
                do {
                  if (iVar8 != 0x1f) {
                    iVar22 = *(int *)((long)__s_00 + uVar27 * 4 + local_160 * uVar11 * 4);
                    uVar24 = (ulong)uVar15;
                    iVar26 = iVar19;
                    do {
                      iVar22 = iVar22 + *(int *)((long)__s + (long)iVar26 * 4);
                      *(int *)((long)__s_00 + uVar27 * 4 + local_160 * uVar11 * 4) = iVar22;
                      iVar26 = iVar26 + 1;
                      uVar24 = uVar24 - 1;
                    } while (uVar24 != 0);
                  }
                  uVar10 = uVar10 + 1;
                  iVar19 = iVar19 + iVar25;
                } while (uVar10 != uVar23);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != uVar11);
          }
          local_160 = local_160 + 1;
        } while (local_160 != uVar14);
      }
      if (uVar14 != 0) {
        lVar28 = (long)(int)(uVar16 * mb_col + uVar14 * mb_row * iVar20);
        uVar27 = (ulong)local_11c;
        iVar25 = 0;
        iVar8 = 0;
        iVar18 = 0;
        uVar15 = 0;
        do {
          if (bVar2 >> bVar5 != 0) {
            lVar29 = 0;
            do {
              if ((uVar3 & 1) == 0) {
                uVar13 = (ushort)puVar4[lVar29 + iVar25 + lVar28];
              }
              else {
                uVar13 = *(ushort *)(lVar28 * 2 + (long)puVar4 * 2 + (long)iVar25 * 2 + lVar29 * 2);
              }
              if ((uVar3 & 1) == 0) {
                uVar21 = (ushort)pred[lVar29 + (long)iVar8 + uVar27];
              }
              else {
                uVar21 = *(ushort *)((long)pred * 2 + uVar27 * 2 + (long)iVar8 * 2 + lVar29 * 2);
              }
              iVar19 = (uint)uVar21 - (uint)uVar13;
              if (uVar21 < uVar13) {
                iVar19 = (uint)uVar13 - (uint)uVar21;
              }
              *(int *)((long)__s + lVar29 * 4 + (long)iVar18 * 4) = iVar19 * iVar19;
              lVar29 = lVar29 + 1;
              uVar23 = (uint)lVar29;
            } while (uVar16 != uVar23);
            iVar18 = iVar18 + uVar23;
            iVar8 = iVar8 + uVar23;
            iVar25 = iVar25 + uVar23;
          }
          iVar25 = iVar25 + (iVar20 - uVar16);
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar14);
        uVar24 = 0;
        lVar28 = 0;
        do {
          if (bVar2 >> bVar5 != 0) {
            dVar33 = local_78[uVar30];
            lVar28 = (long)(int)lVar28;
            uVar17 = 0;
            do {
              iVar8 = -2;
              lVar29 = 0;
              do {
                iVar20 = iVar8 + (int)uVar24;
                iVar18 = uVar14 - 1;
                if (iVar20 < (int)uVar14) {
                  iVar18 = iVar20;
                }
                if (iVar20 < 0) {
                  iVar18 = 0;
                }
                iVar20 = -2;
                do {
                  iVar19 = iVar20 + (int)uVar17;
                  iVar25 = uVar16 - 1;
                  if (iVar19 < (int)uVar16) {
                    iVar25 = iVar19;
                  }
                  if (iVar19 < 0) {
                    iVar25 = 0;
                  }
                  lVar29 = lVar29 + (ulong)*(uint *)((long)__s +
                                                    (long)(int)(iVar25 + iVar18 * uVar16) * 4);
                  iVar20 = iVar20 + 1;
                } while (iVar20 != 3);
                iVar8 = iVar8 + 1;
              } while (iVar8 != 3);
              bVar12 = (char)mbd->bd * '\x02' - 0x10;
              if (mbd->bd < 9) {
                bVar12 = 0;
              }
              uVar9 = lVar29 + (ulong)*(uint *)((long)__s_00 + uVar17 * 4 + uVar24 * uVar11 * 4) >>
                      (bVar12 & 0x3f);
              uVar15 = (uint)((byte)((bVar2 >> bVar5) >> 1) <= uVar17) |
                       (uint)(bVar7 >> 1 <= uVar24) * 2;
              auVar32._8_4_ = (int)(uVar9 >> 0x20);
              auVar32._0_8_ = uVar9;
              auVar32._12_4_ = 0x45300000;
              dVar34 = (((auVar32._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) * dVar35 *
                        0.041666666666666664 + (double)subblock_mses[uVar15] * 0.008333333333333333)
                       * local_58[uVar15] * dVar33;
              if (7.0 <= dVar34) {
                dVar34 = 7.0;
              }
              if (tf_wgt_calc_lvl == 0) {
                dVar34 = exp(-dVar34);
                iVar8 = (int)(dVar34 * 1000.0);
              }
              else {
                iVar8 = (int)((float)((int)((float)dVar34 * -12102203.0) + 0x3f7f127f) * 1000.0 +
                             0.5);
              }
              lVar29 = uVar27 + lVar28;
              if ((uVar3 & 1) == 0) {
                uVar15 = (uint)pred[lVar29];
              }
              else {
                uVar15 = (uint)*(ushort *)((long)pred * 2 + lVar29 * 2);
              }
              accum[lVar29] = accum[lVar29] + uVar15 * iVar8;
              count[lVar29] = count[lVar29] + (short)iVar8;
              lVar28 = lVar28 + 1;
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar11);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar14);
      }
      local_11c = local_11c + uVar16 * uVar14;
      uVar30 = uVar30 + 1;
    } while (uVar30 != (uint)num_planes);
  }
  aom_free(__s);
  aom_free(__s_00);
  return;
}

Assistant:

void av1_apply_temporal_filter_c(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  // Block information.
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int mb_pels = mb_height * mb_width;
  const int is_high_bitdepth = is_frame_high_bitdepth(frame_to_filter);
  const uint16_t *pred16 = CONVERT_TO_SHORTPTR(pred);
  // Frame information.
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Decay factors for non-local mean approach.
  double decay_factor[MAX_MB_PLANE] = { 0 };
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  for (int plane = 0; plane < num_planes; plane++) {
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    decay_factor[plane] = 1 / (n_decay * q_decay * s_decay);
  }
  double d_factor[4] = { 0 };
  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Allocate memory for pixel-wise squared differences. They,
  // regardless of the subsampling, are assigned with memory of size `mb_pels`.
  uint32_t *square_diff = aom_memalign(16, mb_pels * sizeof(uint32_t));
  if (!square_diff) {
    aom_internal_error(mbd->error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(square_diff, 0, mb_pels * sizeof(square_diff[0]));

  // Allocate memory for accumulated luma squared error. This value will be
  // consumed while filtering the chroma planes.
  uint32_t *luma_sse_sum = aom_memalign(32, mb_pels * sizeof(uint32_t));
  if (!luma_sse_sum) {
    aom_free(square_diff);
    aom_internal_error(mbd->error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(luma_sse_sum, 0, mb_pels * sizeof(luma_sse_sum[0]));

  // Get window size for pixel-wise filtering.
  assert(TF_WINDOW_LENGTH % 2 == 1);
  const int half_window = TF_WINDOW_LENGTH >> 1;

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    // Locate pixel on reference frame.
    const int subsampling_y = mbd->plane[plane].subsampling_y;
    const int subsampling_x = mbd->plane[plane].subsampling_x;
    const int h = mb_height >> subsampling_y;  // Plane height.
    const int w = mb_width >> subsampling_x;   // Plane width.
    const int frame_stride =
        frame_to_filter->strides[plane == AOM_PLANE_Y ? 0 : 1];
    const int frame_offset = mb_row * h * frame_stride + mb_col * w;
    const uint8_t *ref = frame_to_filter->buffers[plane];
    const int ss_y_shift =
        subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int ss_x_shift =
        subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane will
    // be more accurate. The luma sse sum is reused in both chroma planes.
    if (plane == AOM_PLANE_U)
      compute_luma_sq_error_sum(square_diff, luma_sse_sum, h, w, ss_x_shift,
                                ss_y_shift);
    compute_square_diff(ref, frame_offset, frame_stride, pred, plane_offset, w,
                        h, w, is_high_bitdepth, square_diff);

    // Perform filtering.
    int pred_idx = 0;
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        // non-local mean approach
        uint64_t sum_square_diff = 0;

        for (int wi = -half_window; wi <= half_window; ++wi) {
          for (int wj = -half_window; wj <= half_window; ++wj) {
            const int y = CLIP(i + wi, 0, h - 1);  // Y-coord on current plane.
            const int x = CLIP(j + wj, 0, w - 1);  // X-coord on current plane.
            sum_square_diff += square_diff[y * w + x];
          }
        }

        sum_square_diff += luma_sse_sum[i * w + j];

        // Scale down the difference for high bit depth input.
        if (mbd->bd > 8) sum_square_diff >>= ((mbd->bd - 8) * 2);

        // Combine window error and block error, and normalize it.
        const double window_error = sum_square_diff * inv_num_ref_pixels;
        const int subblock_idx = (i >= h / 2) * 2 + (j >= w / 2);
        const double block_error = (double)subblock_mses[subblock_idx];
        const double combined_error =
            weight_factor * window_error + block_error * inv_factor;

        // Compute filter weight.
        double scaled_error =
            combined_error * d_factor[subblock_idx] * decay_factor[plane];
        scaled_error = AOMMIN(scaled_error, 7);
        int weight;
        if (tf_wgt_calc_lvl == 0) {
          weight = (int)(exp(-scaled_error) * TF_WEIGHT_SCALE);
        } else {
          const float fweight =
              approx_exp((float)-scaled_error) * TF_WEIGHT_SCALE;
          weight = iroundpf(fweight);
        }

        const int idx = plane_offset + pred_idx;  // Index with plane shift.
        const int pred_value = is_high_bitdepth ? pred16[idx] : pred[idx];
        accum[idx] += weight * pred_value;
        count[idx] += weight;

        ++pred_idx;
      }
    }
    plane_offset += h * w;
  }

  aom_free(square_diff);
  aom_free(luma_sse_sum);
}